

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O1

int mpc_ast_eq(mpc_ast_t *a,mpc_ast_t *b)

{
  uint uVar1;
  mpc_ast_t **ppmVar2;
  mpc_ast_t **ppmVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  
  iVar4 = strcmp(a->tag,b->tag);
  iVar5 = 0;
  if ((iVar4 == 0) && (iVar4 = strcmp(a->contents,b->contents), iVar5 = 0, iVar4 == 0)) {
    uVar1 = a->children_num;
    if ((uVar1 == b->children_num) && (iVar5 = 1, 0 < (int)uVar1)) {
      ppmVar2 = a->children;
      ppmVar3 = b->children;
      uVar6 = 0;
      do {
        iVar4 = mpc_ast_eq(ppmVar2[uVar6],ppmVar3[uVar6]);
        if (iVar4 == 0) {
          return 0;
        }
        uVar6 = uVar6 + 1;
      } while (uVar1 != uVar6);
    }
  }
  return iVar5;
}

Assistant:

int mpc_ast_eq(mpc_ast_t *a, mpc_ast_t *b) {

  int i;

  if (strcmp(a->tag, b->tag) != 0) { return 0; }
  if (strcmp(a->contents, b->contents) != 0) { return 0; }
  if (a->children_num != b->children_num) { return 0; }

  for (i = 0; i < a->children_num; i++) {
    if (!mpc_ast_eq(a->children[i], b->children[i])) { return 0; }
  }

  return 1;
}